

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

QString * __thiscall QCss::Value::toString(Value *this)

{
  QLatin1StringView latin1;
  QLatin1String *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_fffffffffffffff0;
  char *pcVar1;
  
  pcVar1 = *(char **)(in_FS_OFFSET + 0x28);
  if ((int)in_RSI->m_size == 6) {
    ::QVariant::toInt((bool *)&in_RSI->m_data);
    QLatin1String::QLatin1String(in_RSI,(char *)in_RDI);
    latin1.m_data = pcVar1;
    latin1.m_size = in_stack_fffffffffffffff0;
    QString::QString((QString *)in_RSI,latin1);
  }
  else {
    ::QVariant::toString();
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString Value::toString() const
{
    if (type == KnownIdentifier) {
        return QLatin1StringView(values[indexOfId[variant.toInt()]].name);
    } else {
        return variant.toString();
    }
}